

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mont.c
# Opt level: O2

void BN_MONT_CTX_init(BN_MONT_CTX *ctx)

{
  ctx->ri = 0;
  bn_init((BIGNUM *)&ctx->RR);
  bn_init((BIGNUM *)&ctx->N);
  bn_init((BIGNUM *)&ctx->Ni);
  ctx->n0[0] = 0;
  ctx->n0[1] = 0;
  ctx->flags = 0;
  return;
}

Assistant:

void BN_MONT_CTX_init(BN_MONT_CTX *ctx)
{
    ctx->ri = 0;
    bn_init(&(ctx->RR));
    bn_init(&(ctx->N));
    bn_init(&(ctx->Ni));
    ctx->n0[0] = ctx->n0[1] = 0;
    ctx->flags = 0;
}